

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

size_t __thiscall
SGParser::Generator::ParseTableProduction::PrintRHS
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv,bool printDot)

{
  uint uVar1;
  _Alloc_hider _Var2;
  Production *pPVar3;
  mapped_type *ppbVar4;
  ulong uVar5;
  key_type *__k;
  long lVar6;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  String *local_68;
  size_type *local_60;
  String dest;
  
  local_60 = &dest._M_string_length;
  dest._M_dataplus._M_p = (pointer)0x0;
  dest._M_string_length._0_1_ = 0;
  lVar6 = 4;
  dest.field_2._8_8_ = 0;
  local_68 = str;
  for (uVar5 = 0; _Var2._M_p = dest._M_dataplus._M_p, pPVar3 = this->pProduction,
      uVar5 < pPVar3->Length; uVar5 = uVar5 + 1) {
    if ((uVar5 == this->Dot) && (dest.field_2._8_8_ = dest._M_dataplus._M_p, printDot)) {
      std::__cxx11::string::append((char *)&local_60);
      pPVar3 = this->pProduction;
    }
    uVar1 = *(uint *)((long)pPVar3->pRight + lVar6);
    __k = (key_type *)((long)pPVar3->pRight + lVar6);
    if ((int)uVar1 < 0) {
      if (pgrammarSymbolsInv ==
          (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
           *)0x0) {
        if ((uVar1 & 0xfffffff) < 0x22) {
          StringWithFormat<char>(&local_88,"\'%X\' ",(ulong)(uVar1 & 0xfffffff));
          std::__cxx11::string::append((string *)&local_60);
        }
        else {
          StringWithFormat<char>(&local_88,"\'%c\' ",(ulong)(uint)(int)(char)((char)uVar1 + -2));
          std::__cxx11::string::append((string *)&local_60);
        }
      }
      else {
        ppbVar4 = std::
                  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  ::operator[](pgrammarSymbolsInv,__k);
        StringWithFormat<char>(&local_88,"\'%s\' ",((*ppbVar4)->_M_dataplus)._M_p);
        std::__cxx11::string::append((string *)&local_60);
      }
    }
    else if (pgrammarSymbolsInv ==
             (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
              *)0x0) {
      StringWithFormat<char>(&local_88,"%u ");
      std::__cxx11::string::append((string *)&local_60);
    }
    else {
      ppbVar4 = std::
                map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                ::operator[](pgrammarSymbolsInv,__k);
      std::operator+(&local_88,*ppbVar4," ");
      std::__cxx11::string::append((string *)&local_60);
    }
    std::__cxx11::string::~string((string *)&local_88);
    lVar6 = lVar6 + 4;
  }
  uVar7 = dest.field_2._8_8_;
  if ((this->Dot == (uint)uVar5) && (uVar7 = _Var2._M_p, printDot)) {
    std::__cxx11::string::append((char *)&local_60);
  }
  std::__cxx11::string::swap((string *)local_68);
  std::__cxx11::string::~string((string *)&local_60);
  return (size_t)(pointer)uVar7;
}

Assistant:

size_t ParseTableProduction::PrintRHS(String& str,
                                      std::map<unsigned, const String*>* pgrammarSymbolsInv,
                                      bool printDot) const {
    String dest;
    size_t dotPos = 0u;

    // Go through all right hand side terminals and store them
    unsigned i = 0u;
    for (; i < pProduction->Length; ++i) {
        if (Dot == i) {
            dotPos = dest.size();
            if (printDot)
                dest += "* ";
        }

        if (pProduction->Right(i) & ProductionMask::Terminal) {
            if (pgrammarSymbolsInv)
                dest += StringWithFormat("'%s' ",
                                         (*pgrammarSymbolsInv)[pProduction->Right(i)]->data());
            else {
                const unsigned terminal = pProduction->Right(i) & ProductionMask::TerminalValue;
                if (terminal < 32u + TokenCode::TokenFirstID)
                    dest += StringWithFormat("'%X' ", terminal);
                else
                    dest += StringWithFormat("'%c' ", char(terminal - TokenCode::TokenFirstID));
            }
        } else {
            if (pgrammarSymbolsInv)
                dest += *(*pgrammarSymbolsInv)[pProduction->Right(i)] + " ";
            else
                dest += StringWithFormat("%u ", pProduction->Right(i));
        }
    }

    if (Dot == i) {
        dotPos = dest.size();
        if (printDot)
            dest += "* ";
    }

    str.swap(dest);

    return dotPos;
}